

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr_test.cpp
# Opt level: O0

void __thiscall TaggedPointer_Dispatch_Test::TestBody(TaggedPointer_Dispatch_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_59;
  AssertionResult gtest_ar_58;
  AssertionResult gtest_ar_57;
  AssertionResult gtest_ar_56;
  Handle h14;
  IntType<14> it14;
  AssertionResult gtest_ar_55;
  AssertionResult gtest_ar_54;
  AssertionResult gtest_ar_53;
  AssertionResult gtest_ar_52;
  Handle h13;
  IntType<13> it13;
  AssertionResult gtest_ar_51;
  AssertionResult gtest_ar_50;
  AssertionResult gtest_ar_49;
  AssertionResult gtest_ar_48;
  Handle h12;
  IntType<12> it12;
  AssertionResult gtest_ar_47;
  AssertionResult gtest_ar_46;
  AssertionResult gtest_ar_45;
  AssertionResult gtest_ar_44;
  Handle h11;
  IntType<11> it11;
  AssertionResult gtest_ar_43;
  AssertionResult gtest_ar_42;
  AssertionResult gtest_ar_41;
  AssertionResult gtest_ar_40;
  Handle h10;
  IntType<10> it10;
  AssertionResult gtest_ar_39;
  AssertionResult gtest_ar_38;
  AssertionResult gtest_ar_37;
  AssertionResult gtest_ar_36;
  Handle h9;
  IntType<9> it9;
  AssertionResult gtest_ar_35;
  AssertionResult gtest_ar_34;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  Handle h8;
  IntType<8> it8;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  Handle h7;
  IntType<7> it7;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  Handle h6;
  IntType<6> it6;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  Handle h5;
  IntType<5> it5;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  Handle h4;
  IntType<4> it4;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  Handle h3;
  IntType<3> it3;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  Handle h2;
  IntType<2> it2;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  Handle h1;
  IntType<1> it1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Handle h0;
  IntType<0> it0;
  IntType<14> *in_stack_ffffffffffffef78;
  AssertHelper *in_stack_ffffffffffffef80;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffef88;
  undefined1 in_stack_ffffffffffffef8f;
  char *in_stack_ffffffffffffef90;
  char *in_stack_ffffffffffffef98;
  int iVar3;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffefa0;
  undefined1 in_stack_ffffffffffffefa7;
  undefined1 uVar4;
  undefined8 in_stack_ffffffffffffefa8;
  Type type;
  AssertHelper *in_stack_ffffffffffffefb0;
  AssertionResult *this_02;
  Message *in_stack_ffffffffffffeff8;
  AssertHelper *in_stack_fffffffffffff000;
  AssertionResult *this_03;
  AssertionResult local_a58 [2];
  int local_a38;
  undefined4 local_a34;
  AssertionResult local_a30 [2];
  int local_a10;
  undefined4 local_a0c;
  AssertionResult local_a08 [2];
  int local_9e8;
  undefined4 local_9e4;
  AssertionResult local_9e0;
  IntType<14> local_9c1 [17];
  int local_9b0;
  undefined4 local_9ac;
  AssertionResult local_9a8 [2];
  int local_988;
  undefined4 local_984;
  AssertionResult local_980 [2];
  int local_960;
  undefined4 local_95c;
  AssertionResult local_958 [2];
  int local_938;
  undefined4 local_934;
  AssertionResult local_930;
  IntType<13> local_911 [17];
  int local_900;
  undefined4 local_8fc;
  AssertionResult local_8f8 [2];
  int local_8d8;
  undefined4 local_8d4;
  AssertionResult local_8d0 [2];
  int local_8b0;
  undefined4 local_8ac;
  AssertionResult local_8a8 [2];
  int local_888;
  undefined4 local_884;
  AssertionResult local_880;
  IntType<12> local_861 [17];
  int local_850;
  undefined4 local_84c;
  AssertionResult local_848 [2];
  int local_828;
  undefined4 local_824;
  AssertionResult local_820 [2];
  int local_800;
  undefined4 local_7fc;
  AssertionResult local_7f8 [2];
  int local_7d8;
  undefined4 local_7d4;
  AssertionResult local_7d0;
  IntType<11> local_7b1 [17];
  int local_7a0;
  undefined4 local_79c;
  AssertionResult local_798 [2];
  int local_778;
  undefined4 local_774;
  AssertionResult local_770 [2];
  int local_750;
  undefined4 local_74c;
  AssertionResult local_748 [2];
  int local_728;
  undefined4 local_724;
  AssertionResult local_720;
  IntType<10> local_701 [17];
  int local_6f0;
  undefined4 local_6ec;
  AssertionResult local_6e8 [2];
  int local_6c8;
  undefined4 local_6c4;
  AssertionResult local_6c0 [2];
  int local_6a0;
  undefined4 local_69c;
  AssertionResult local_698 [2];
  int local_678;
  undefined4 local_674;
  AssertionResult local_670;
  IntType<9> local_651 [17];
  int local_640;
  undefined4 local_63c;
  AssertionResult local_638 [2];
  int local_618;
  undefined4 local_614;
  AssertionResult local_610 [2];
  int local_5f0;
  undefined4 local_5ec;
  AssertionResult local_5e8 [2];
  int local_5c8;
  undefined4 local_5c4;
  AssertionResult local_5c0;
  IntType<8> local_5a1 [17];
  int local_590;
  undefined4 local_58c;
  AssertionResult local_588 [2];
  int local_568;
  undefined4 local_564;
  AssertionResult local_560 [2];
  int local_540;
  undefined4 local_53c;
  AssertionResult local_538 [2];
  int local_518;
  undefined4 local_514;
  AssertionResult local_510;
  IntType<7> local_4f1 [17];
  int local_4e0;
  undefined4 local_4dc;
  AssertionResult local_4d8 [2];
  int local_4b8;
  undefined4 local_4b4;
  AssertionResult local_4b0 [2];
  int local_490;
  undefined4 local_48c;
  AssertionResult local_488 [2];
  int local_468;
  undefined4 local_464;
  AssertionResult local_460;
  IntType<6> local_441 [17];
  int local_430;
  undefined4 local_42c;
  AssertionResult local_428 [2];
  int local_408;
  undefined4 local_404;
  AssertionResult local_400 [2];
  int local_3e0;
  undefined4 local_3dc;
  AssertionResult local_3d8 [2];
  int local_3b8;
  undefined4 local_3b4;
  AssertionResult local_3b0;
  IntType<5> local_391 [17];
  int local_380;
  undefined4 local_37c;
  AssertionResult local_378 [2];
  int local_358;
  undefined4 local_354;
  AssertionResult local_350 [2];
  int local_330;
  undefined4 local_32c;
  AssertionResult local_328 [2];
  int local_308;
  undefined4 local_304;
  AssertionResult local_300;
  IntType<4> local_2e1 [17];
  int local_2d0;
  undefined4 local_2cc;
  AssertionResult local_2c8 [2];
  int local_2a8;
  undefined4 local_2a4;
  AssertionResult local_2a0 [2];
  int local_280;
  undefined4 local_27c;
  AssertionResult local_278 [2];
  int local_258;
  undefined4 local_254;
  AssertionResult local_250;
  IntType<3> local_231 [17];
  int local_220;
  undefined4 local_21c;
  AssertionResult local_218 [2];
  int local_1f8;
  undefined4 local_1f4;
  AssertionResult local_1f0 [2];
  int local_1d0;
  undefined4 local_1cc;
  AssertionResult local_1c8 [2];
  int local_1a8;
  undefined4 local_1a4;
  AssertionResult local_1a0;
  IntType<2> local_181 [17];
  int local_170;
  undefined4 local_16c;
  AssertionResult local_168 [2];
  int local_148;
  undefined4 local_144;
  AssertionResult local_140 [2];
  int local_120;
  undefined4 local_11c;
  AssertionResult local_118 [2];
  int local_f8;
  undefined4 local_f4;
  AssertionResult local_f0;
  IntType<1> local_d1 [17];
  int local_c0;
  undefined4 local_bc;
  AssertionResult local_b8 [2];
  int local_98;
  undefined4 local_94;
  AssertionResult local_90 [2];
  int local_70;
  undefined4 local_6c;
  AssertionResult local_68;
  uint local_54;
  int local_30;
  undefined4 local_2c;
  AssertionResult local_28;
  IntType<0> local_9 [9];
  
  type = (Type)((ulong)in_stack_ffffffffffffefa8 >> 0x20);
  Handle::TaggedPointer<IntType<0>>
            ((Handle *)in_stack_ffffffffffffef80,(IntType<0> *)in_stack_ffffffffffffef78);
  local_2c = 0;
  local_30 = IntType<0>::func(local_9);
  testing::internal::EqHelper<true>::Compare<int,int>
            (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
             (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (int *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x668200);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffefb0,type,
               (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
               (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
    testing::Message::~Message((Message *)0x668263);
  }
  local_54 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x6682d1);
  if (local_54 == 0) {
    local_6c = 0;
    local_70 = Handle::func((Handle *)in_stack_ffffffffffffef80);
    testing::internal::EqHelper<true>::Compare<int,int>
              (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
               (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (int *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
      testing::AssertionResult::failure_message((AssertionResult *)0x6683a9);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffefb0,type,
                 (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                 (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
      testing::Message::~Message((Message *)0x66840c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x668464);
    local_94 = 0;
    local_98 = IntType<0>::cfunc(local_9);
    testing::internal::EqHelper<true>::Compare<int,int>
              (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
               (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (int *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_90);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
      testing::AssertionResult::failure_message((AssertionResult *)0x66852a);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffefb0,type,
                 (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                 (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
      testing::Message::~Message((Message *)0x66858d);
    }
    local_54 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x6685fb);
    if (local_54 == 0) {
      local_bc = 0;
      local_c0 = Handle::cfunc((Handle *)in_stack_ffffffffffffef80);
      testing::internal::EqHelper<true>::Compare<int,int>
                (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                 (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                 (int *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
        testing::AssertionResult::failure_message((AssertionResult *)0x6686d3);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffefb0,type,
                   (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                   (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
        testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
        testing::Message::~Message((Message *)0x668736);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x66878e);
      Handle::TaggedPointer<IntType<1>>
                ((Handle *)in_stack_ffffffffffffef80,(IntType<1> *)in_stack_ffffffffffffef78);
      local_f4 = 1;
      local_f8 = IntType<1>::func(local_d1);
      testing::internal::EqHelper<false>::Compare<int,int>
                (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                 (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                 (int *)in_stack_ffffffffffffef80);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
        testing::AssertionResult::failure_message((AssertionResult *)0x66886c);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffefb0,type,
                   (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                   (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
        testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
        testing::Message::~Message((Message *)0x6688cf);
      }
      local_54 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x66893d);
      if (local_54 == 0) {
        local_11c = 1;
        local_120 = Handle::func((Handle *)in_stack_ffffffffffffef80);
        testing::internal::EqHelper<false>::Compare<int,int>
                  (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                   (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                   (int *)in_stack_ffffffffffffef80);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
          testing::AssertionResult::failure_message((AssertionResult *)0x668a10);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_ffffffffffffefb0,type,
                     (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                     (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
          testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
          testing::Message::~Message((Message *)0x668a73);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x668acb);
        local_144 = 1;
        local_148 = IntType<1>::cfunc(local_d1);
        testing::internal::EqHelper<false>::Compare<int,int>
                  (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                   (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                   (int *)in_stack_ffffffffffffef80);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
          testing::AssertionResult::failure_message((AssertionResult *)0x668b8c);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_ffffffffffffefb0,type,
                     (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                     (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
          testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
          testing::Message::~Message((Message *)0x668bef);
        }
        local_54 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x668c5d);
        if (local_54 == 0) {
          local_16c = 1;
          local_170 = Handle::cfunc((Handle *)in_stack_ffffffffffffef80);
          testing::internal::EqHelper<false>::Compare<int,int>
                    (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                     (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                     (int *)in_stack_ffffffffffffef80);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
            testing::AssertionResult::failure_message((AssertionResult *)0x668d30);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_ffffffffffffefb0,type,
                       (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                       (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
            testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
            testing::Message::~Message((Message *)0x668d93);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x668deb);
          Handle::TaggedPointer<IntType<2>>
                    ((Handle *)in_stack_ffffffffffffef80,(IntType<2> *)in_stack_ffffffffffffef78);
          local_1a4 = 2;
          local_1a8 = IntType<2>::func(local_181);
          testing::internal::EqHelper<false>::Compare<int,int>
                    (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                     (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                     (int *)in_stack_ffffffffffffef80);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
            testing::AssertionResult::failure_message((AssertionResult *)0x668ec9);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_ffffffffffffefb0,type,
                       (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                       (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
            testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
            testing::Message::~Message((Message *)0x668f2c);
          }
          local_54 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x668f9a);
          if (local_54 == 0) {
            local_1cc = 2;
            local_1d0 = Handle::func((Handle *)in_stack_ffffffffffffef80);
            testing::internal::EqHelper<false>::Compare<int,int>
                      (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                       (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                       (int *)in_stack_ffffffffffffef80);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
              testing::AssertionResult::failure_message((AssertionResult *)0x66906d);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_ffffffffffffefb0,type,
                         (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                         (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
              testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
              testing::Message::~Message((Message *)0x6690d0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x669128);
            local_1f4 = 2;
            local_1f8 = IntType<2>::cfunc(local_181);
            testing::internal::EqHelper<false>::Compare<int,int>
                      (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                       (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                       (int *)in_stack_ffffffffffffef80);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f0);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
              testing::AssertionResult::failure_message((AssertionResult *)0x6691e9);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_ffffffffffffefb0,type,
                         (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                         (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
              testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
              testing::Message::~Message((Message *)0x66924c);
            }
            local_54 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x6692ba);
            if (local_54 == 0) {
              local_21c = 2;
              local_220 = Handle::cfunc((Handle *)in_stack_ffffffffffffef80);
              testing::internal::EqHelper<false>::Compare<int,int>
                        (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                         (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                         (int *)in_stack_ffffffffffffef80);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_218);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                testing::AssertionResult::failure_message((AssertionResult *)0x66938d);
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_ffffffffffffefb0,type,
                           (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                           (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90
                          );
                testing::internal::AssertHelper::operator=
                          (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
                testing::Message::~Message((Message *)0x6693f0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x669448);
              Handle::TaggedPointer<IntType<3>>
                        ((Handle *)in_stack_ffffffffffffef80,(IntType<3> *)in_stack_ffffffffffffef78
                        );
              local_254 = 3;
              local_258 = IntType<3>::func(local_231);
              testing::internal::EqHelper<false>::Compare<int,int>
                        (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                         (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                         (int *)in_stack_ffffffffffffef80);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                testing::AssertionResult::failure_message((AssertionResult *)0x669526);
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_ffffffffffffefb0,type,
                           (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                           (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),in_stack_ffffffffffffef90
                          );
                testing::internal::AssertHelper::operator=
                          (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
                testing::Message::~Message((Message *)0x669589);
              }
              local_54 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x6695f7);
              if (local_54 == 0) {
                local_27c = 3;
                local_280 = Handle::func((Handle *)in_stack_ffffffffffffef80);
                testing::internal::EqHelper<false>::Compare<int,int>
                          (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                           (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                           (int *)in_stack_ffffffffffffef80);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_278);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                  testing::AssertionResult::failure_message((AssertionResult *)0x6696ca);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_ffffffffffffefb0,type,
                             (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                             (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                             in_stack_ffffffffffffef90);
                  testing::internal::AssertHelper::operator=
                            (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                  testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
                  testing::Message::~Message((Message *)0x66972d);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x669785);
                local_2a4 = 3;
                local_2a8 = IntType<3>::cfunc(local_231);
                testing::internal::EqHelper<false>::Compare<int,int>
                          (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                           (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                           (int *)in_stack_ffffffffffffef80);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a0);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                  testing::AssertionResult::failure_message((AssertionResult *)0x669846);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_ffffffffffffefb0,type,
                             (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                             (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                             in_stack_ffffffffffffef90);
                  testing::internal::AssertHelper::operator=
                            (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                  testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
                  testing::Message::~Message((Message *)0x6698a9);
                }
                local_54 = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x669917);
                if (local_54 == 0) {
                  local_2cc = 3;
                  local_2d0 = Handle::cfunc((Handle *)in_stack_ffffffffffffef80);
                  testing::internal::EqHelper<false>::Compare<int,int>
                            (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                             (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                             (int *)in_stack_ffffffffffffef80);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c8);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                    testing::AssertionResult::failure_message((AssertionResult *)0x6699ea);
                    testing::internal::AssertHelper::AssertHelper
                              (in_stack_ffffffffffffefb0,type,
                               (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0)
                               ,(int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                               in_stack_ffffffffffffef90);
                    testing::internal::AssertHelper::operator=
                              (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
                    testing::Message::~Message((Message *)0x669a4d);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x669aa5);
                  Handle::TaggedPointer<IntType<4>>
                            ((Handle *)in_stack_ffffffffffffef80,
                             (IntType<4> *)in_stack_ffffffffffffef78);
                  local_304 = 4;
                  local_308 = IntType<4>::func(local_2e1);
                  testing::internal::EqHelper<false>::Compare<int,int>
                            (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                             (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                             (int *)in_stack_ffffffffffffef80);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_300);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                    testing::AssertionResult::failure_message((AssertionResult *)0x669b83);
                    testing::internal::AssertHelper::AssertHelper
                              (in_stack_ffffffffffffefb0,type,
                               (char *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0)
                               ,(int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                               in_stack_ffffffffffffef90);
                    testing::internal::AssertHelper::operator=
                              (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
                    testing::Message::~Message((Message *)0x669be6);
                  }
                  local_54 = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x669c54);
                  if (local_54 == 0) {
                    local_32c = 4;
                    local_330 = Handle::func((Handle *)in_stack_ffffffffffffef80);
                    testing::internal::EqHelper<false>::Compare<int,int>
                              (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                               (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                               (int *)in_stack_ffffffffffffef80);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_328);
                    if (!bVar1) {
                      testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                      testing::AssertionResult::failure_message((AssertionResult *)0x669d27);
                      testing::internal::AssertHelper::AssertHelper
                                (in_stack_ffffffffffffefb0,type,
                                 (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                 (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                 in_stack_ffffffffffffef90);
                      testing::internal::AssertHelper::operator=
                                (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
                      testing::Message::~Message((Message *)0x669d8a);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x669de2);
                    local_354 = 4;
                    local_358 = IntType<4>::cfunc(local_2e1);
                    testing::internal::EqHelper<false>::Compare<int,int>
                              (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                               (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                               (int *)in_stack_ffffffffffffef80);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_350);
                    if (!bVar1) {
                      testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                      testing::AssertionResult::failure_message((AssertionResult *)0x669ea3);
                      testing::internal::AssertHelper::AssertHelper
                                (in_stack_ffffffffffffefb0,type,
                                 (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                 (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                 in_stack_ffffffffffffef90);
                      testing::internal::AssertHelper::operator=
                                (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
                      testing::Message::~Message((Message *)0x669f06);
                    }
                    local_54 = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x669f74);
                    if (local_54 == 0) {
                      local_37c = 4;
                      local_380 = Handle::cfunc((Handle *)in_stack_ffffffffffffef80);
                      testing::internal::EqHelper<false>::Compare<int,int>
                                (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                 (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88
                                                ),(int *)in_stack_ffffffffffffef80);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_378);
                      if (!bVar1) {
                        testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                        testing::AssertionResult::failure_message((AssertionResult *)0x66a047);
                        testing::internal::AssertHelper::AssertHelper
                                  (in_stack_ffffffffffffefb0,type,
                                   (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                    in_stack_ffffffffffffefa0),
                                   (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                   in_stack_ffffffffffffef90);
                        testing::internal::AssertHelper::operator=
                                  (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                        testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
                        testing::Message::~Message((Message *)0x66a0aa);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x66a102);
                      Handle::TaggedPointer<IntType<5>>
                                ((Handle *)in_stack_ffffffffffffef80,
                                 (IntType<5> *)in_stack_ffffffffffffef78);
                      local_3b4 = 5;
                      local_3b8 = IntType<5>::func(local_391);
                      testing::internal::EqHelper<false>::Compare<int,int>
                                (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                 (int *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88
                                                ),(int *)in_stack_ffffffffffffef80);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
                      if (!bVar1) {
                        testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                        testing::AssertionResult::failure_message((AssertionResult *)0x66a1e0);
                        testing::internal::AssertHelper::AssertHelper
                                  (in_stack_ffffffffffffefb0,type,
                                   (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                    in_stack_ffffffffffffefa0),
                                   (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                   in_stack_ffffffffffffef90);
                        testing::internal::AssertHelper::operator=
                                  (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                        testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
                        testing::Message::~Message((Message *)0x66a243);
                      }
                      local_54 = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x66a2b1);
                      if (local_54 == 0) {
                        local_3dc = 5;
                        local_3e0 = Handle::func((Handle *)in_stack_ffffffffffffef80);
                        testing::internal::EqHelper<false>::Compare<int,int>
                                  (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                   (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                   in_stack_ffffffffffffef88),
                                   (int *)in_stack_ffffffffffffef80);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
                        if (!bVar1) {
                          testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                          testing::AssertionResult::failure_message((AssertionResult *)0x66a384);
                          testing::internal::AssertHelper::AssertHelper
                                    (in_stack_ffffffffffffefb0,type,
                                     (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                      in_stack_ffffffffffffefa0),
                                     (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                     in_stack_ffffffffffffef90);
                          testing::internal::AssertHelper::operator=
                                    (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                          testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
                          testing::Message::~Message((Message *)0x66a3e7);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x66a43f);
                        local_404 = 5;
                        local_408 = IntType<5>::cfunc(local_391);
                        testing::internal::EqHelper<false>::Compare<int,int>
                                  (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                   (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                   in_stack_ffffffffffffef88),
                                   (int *)in_stack_ffffffffffffef80);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_400);
                        if (!bVar1) {
                          testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                          testing::AssertionResult::failure_message((AssertionResult *)0x66a500);
                          testing::internal::AssertHelper::AssertHelper
                                    (in_stack_ffffffffffffefb0,type,
                                     (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                      in_stack_ffffffffffffefa0),
                                     (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                     in_stack_ffffffffffffef90);
                          testing::internal::AssertHelper::operator=
                                    (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                          testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffef80);
                          testing::Message::~Message((Message *)0x66a563);
                        }
                        local_54 = (uint)!bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x66a5d1);
                        if (local_54 == 0) {
                          local_42c = 5;
                          local_430 = Handle::cfunc((Handle *)in_stack_ffffffffffffef80);
                          testing::internal::EqHelper<false>::Compare<int,int>
                                    (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                     (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                     in_stack_ffffffffffffef88),
                                     (int *)in_stack_ffffffffffffef80);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_428);
                          if (!bVar1) {
                            testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                            testing::AssertionResult::failure_message((AssertionResult *)0x66a6a4);
                            testing::internal::AssertHelper::AssertHelper
                                      (in_stack_ffffffffffffefb0,type,
                                       (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                        in_stack_ffffffffffffefa0),
                                       (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                       in_stack_ffffffffffffef90);
                            testing::internal::AssertHelper::operator=
                                      (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                            testing::internal::AssertHelper::~AssertHelper
                                      (in_stack_ffffffffffffef80);
                            testing::Message::~Message((Message *)0x66a707);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)0x66a75f);
                          Handle::TaggedPointer<IntType<6>>
                                    ((Handle *)in_stack_ffffffffffffef80,
                                     (IntType<6> *)in_stack_ffffffffffffef78);
                          local_464 = 6;
                          local_468 = IntType<6>::func(local_441);
                          testing::internal::EqHelper<false>::Compare<int,int>
                                    (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                     (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                     in_stack_ffffffffffffef88),
                                     (int *)in_stack_ffffffffffffef80);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_460);
                          if (!bVar1) {
                            testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                            testing::AssertionResult::failure_message((AssertionResult *)0x66a83d);
                            testing::internal::AssertHelper::AssertHelper
                                      (in_stack_ffffffffffffefb0,type,
                                       (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                        in_stack_ffffffffffffefa0),
                                       (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                       in_stack_ffffffffffffef90);
                            testing::internal::AssertHelper::operator=
                                      (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                            testing::internal::AssertHelper::~AssertHelper
                                      (in_stack_ffffffffffffef80);
                            testing::Message::~Message((Message *)0x66a8a0);
                          }
                          local_54 = (uint)!bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)0x66a90e);
                          if (local_54 == 0) {
                            local_48c = 6;
                            local_490 = Handle::func((Handle *)in_stack_ffffffffffffef80);
                            testing::internal::EqHelper<false>::Compare<int,int>
                                      (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                       (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                       in_stack_ffffffffffffef88),
                                       (int *)in_stack_ffffffffffffef80);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_488);
                            if (!bVar1) {
                              testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                              testing::AssertionResult::failure_message((AssertionResult *)0x66a9e1)
                              ;
                              testing::internal::AssertHelper::AssertHelper
                                        (in_stack_ffffffffffffefb0,type,
                                         (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                          in_stack_ffffffffffffefa0),
                                         (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                         in_stack_ffffffffffffef90);
                              testing::internal::AssertHelper::operator=
                                        (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                              testing::internal::AssertHelper::~AssertHelper
                                        (in_stack_ffffffffffffef80);
                              testing::Message::~Message((Message *)0x66aa44);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)0x66aa9c);
                            local_4b4 = 6;
                            local_4b8 = IntType<6>::cfunc(local_441);
                            testing::internal::EqHelper<false>::Compare<int,int>
                                      (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                       (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                       in_stack_ffffffffffffef88),
                                       (int *)in_stack_ffffffffffffef80);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b0);
                            if (!bVar1) {
                              testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                              testing::AssertionResult::failure_message((AssertionResult *)0x66ab5d)
                              ;
                              testing::internal::AssertHelper::AssertHelper
                                        (in_stack_ffffffffffffefb0,type,
                                         (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                          in_stack_ffffffffffffefa0),
                                         (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                         in_stack_ffffffffffffef90);
                              testing::internal::AssertHelper::operator=
                                        (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                              testing::internal::AssertHelper::~AssertHelper
                                        (in_stack_ffffffffffffef80);
                              testing::Message::~Message((Message *)0x66abc0);
                            }
                            local_54 = (uint)!bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)0x66ac2e);
                            if (local_54 == 0) {
                              local_4dc = 6;
                              local_4e0 = Handle::cfunc((Handle *)in_stack_ffffffffffffef80);
                              testing::internal::EqHelper<false>::Compare<int,int>
                                        (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                         (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                         in_stack_ffffffffffffef88),
                                         (int *)in_stack_ffffffffffffef80);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4d8);
                              if (!bVar1) {
                                testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                                testing::AssertionResult::failure_message
                                          ((AssertionResult *)0x66ad01);
                                testing::internal::AssertHelper::AssertHelper
                                          (in_stack_ffffffffffffefb0,type,
                                           (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                            in_stack_ffffffffffffefa0),
                                           (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                           in_stack_ffffffffffffef90);
                                testing::internal::AssertHelper::operator=
                                          (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                                testing::internal::AssertHelper::~AssertHelper
                                          (in_stack_ffffffffffffef80);
                                testing::Message::~Message((Message *)0x66ad64);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)0x66adbc);
                              Handle::TaggedPointer<IntType<7>>
                                        ((Handle *)in_stack_ffffffffffffef80,
                                         (IntType<7> *)in_stack_ffffffffffffef78);
                              local_514 = 7;
                              local_518 = IntType<7>::func(local_4f1);
                              testing::internal::EqHelper<false>::Compare<int,int>
                                        (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                         (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                         in_stack_ffffffffffffef88),
                                         (int *)in_stack_ffffffffffffef80);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_510);
                              if (!bVar1) {
                                testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                                testing::AssertionResult::failure_message
                                          ((AssertionResult *)0x66ae9a);
                                testing::internal::AssertHelper::AssertHelper
                                          (in_stack_ffffffffffffefb0,type,
                                           (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                            in_stack_ffffffffffffefa0),
                                           (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                           in_stack_ffffffffffffef90);
                                testing::internal::AssertHelper::operator=
                                          (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                                testing::internal::AssertHelper::~AssertHelper
                                          (in_stack_ffffffffffffef80);
                                testing::Message::~Message((Message *)0x66aefd);
                              }
                              local_54 = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)0x66af6b);
                              if (local_54 == 0) {
                                local_53c = 7;
                                local_540 = Handle::func((Handle *)in_stack_ffffffffffffef80);
                                testing::internal::EqHelper<false>::Compare<int,int>
                                          (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                           (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                           in_stack_ffffffffffffef88),
                                           (int *)in_stack_ffffffffffffef80);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_538);
                                if (!bVar1) {
                                  testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                                  testing::AssertionResult::failure_message
                                            ((AssertionResult *)0x66b03e);
                                  testing::internal::AssertHelper::AssertHelper
                                            (in_stack_ffffffffffffefb0,type,
                                             (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                              in_stack_ffffffffffffefa0),
                                             (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                             in_stack_ffffffffffffef90);
                                  testing::internal::AssertHelper::operator=
                                            (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                                  testing::internal::AssertHelper::~AssertHelper
                                            (in_stack_ffffffffffffef80);
                                  testing::Message::~Message((Message *)0x66b0a1);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)0x66b0f9);
                                local_564 = 7;
                                local_568 = IntType<7>::cfunc(local_4f1);
                                testing::internal::EqHelper<false>::Compare<int,int>
                                          (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                           (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                           in_stack_ffffffffffffef88),
                                           (int *)in_stack_ffffffffffffef80);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_560);
                                if (!bVar1) {
                                  testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                                  testing::AssertionResult::failure_message
                                            ((AssertionResult *)0x66b1ba);
                                  testing::internal::AssertHelper::AssertHelper
                                            (in_stack_ffffffffffffefb0,type,
                                             (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                              in_stack_ffffffffffffefa0),
                                             (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                             in_stack_ffffffffffffef90);
                                  testing::internal::AssertHelper::operator=
                                            (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                                  testing::internal::AssertHelper::~AssertHelper
                                            (in_stack_ffffffffffffef80);
                                  testing::Message::~Message((Message *)0x66b21d);
                                }
                                local_54 = (uint)!bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)0x66b28b);
                                if (local_54 == 0) {
                                  local_58c = 7;
                                  local_590 = Handle::cfunc((Handle *)in_stack_ffffffffffffef80);
                                  testing::internal::EqHelper<false>::Compare<int,int>
                                            (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                             (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                             in_stack_ffffffffffffef88),
                                             (int *)in_stack_ffffffffffffef80);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_588)
                                  ;
                                  if (!bVar1) {
                                    testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                                    testing::AssertionResult::failure_message
                                              ((AssertionResult *)0x66b35e);
                                    testing::internal::AssertHelper::AssertHelper
                                              (in_stack_ffffffffffffefb0,type,
                                               (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                                in_stack_ffffffffffffefa0),
                                               (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                               in_stack_ffffffffffffef90);
                                    testing::internal::AssertHelper::operator=
                                              (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                                    testing::internal::AssertHelper::~AssertHelper
                                              (in_stack_ffffffffffffef80);
                                    testing::Message::~Message((Message *)0x66b3c1);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)0x66b419);
                                  Handle::TaggedPointer<IntType<8>>
                                            ((Handle *)in_stack_ffffffffffffef80,
                                             (IntType<8> *)in_stack_ffffffffffffef78);
                                  local_5c4 = 8;
                                  local_5c8 = IntType<8>::func(local_5a1);
                                  testing::internal::EqHelper<false>::Compare<int,int>
                                            (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                             (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                             in_stack_ffffffffffffef88),
                                             (int *)in_stack_ffffffffffffef80);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    (&local_5c0);
                                  if (!bVar1) {
                                    testing::Message::Message((Message *)in_stack_ffffffffffffefb0);
                                    testing::AssertionResult::failure_message
                                              ((AssertionResult *)0x66b4f7);
                                    testing::internal::AssertHelper::AssertHelper
                                              (in_stack_ffffffffffffefb0,type,
                                               (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                                in_stack_ffffffffffffefa0),
                                               (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                               in_stack_ffffffffffffef90);
                                    testing::internal::AssertHelper::operator=
                                              (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
                                    testing::internal::AssertHelper::~AssertHelper
                                              (in_stack_ffffffffffffef80);
                                    testing::Message::~Message((Message *)0x66b55a);
                                  }
                                  local_54 = (uint)!bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)0x66b5c8);
                                  if (local_54 == 0) {
                                    local_5ec = 8;
                                    local_5f0 = Handle::func((Handle *)in_stack_ffffffffffffef80);
                                    testing::internal::EqHelper<false>::Compare<int,int>
                                              (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                               (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                               in_stack_ffffffffffffef88),
                                               (int *)in_stack_ffffffffffffef80);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      (local_5e8);
                                    if (!bVar1) {
                                      testing::Message::Message
                                                ((Message *)in_stack_ffffffffffffefb0);
                                      testing::AssertionResult::failure_message
                                                ((AssertionResult *)0x66b69b);
                                      testing::internal::AssertHelper::AssertHelper
                                                (in_stack_ffffffffffffefb0,type,
                                                 (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                                  in_stack_ffffffffffffefa0),
                                                 (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                 in_stack_ffffffffffffef90);
                                      testing::internal::AssertHelper::operator=
                                                (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8
                                                );
                                      testing::internal::AssertHelper::~AssertHelper
                                                (in_stack_ffffffffffffef80);
                                      testing::Message::~Message((Message *)0x66b6fe);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)0x66b756);
                                    local_614 = 8;
                                    local_618 = IntType<8>::cfunc(local_5a1);
                                    testing::internal::EqHelper<false>::Compare<int,int>
                                              (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
                                               (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                               in_stack_ffffffffffffef88),
                                               (int *)in_stack_ffffffffffffef80);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      (local_610);
                                    if (!bVar1) {
                                      testing::Message::Message
                                                ((Message *)in_stack_ffffffffffffefb0);
                                      testing::AssertionResult::failure_message
                                                ((AssertionResult *)0x66b817);
                                      testing::internal::AssertHelper::AssertHelper
                                                (in_stack_ffffffffffffefb0,type,
                                                 (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                                  in_stack_ffffffffffffefa0),
                                                 (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                 in_stack_ffffffffffffef90);
                                      testing::internal::AssertHelper::operator=
                                                (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8
                                                );
                                      testing::internal::AssertHelper::~AssertHelper
                                                (in_stack_ffffffffffffef80);
                                      testing::Message::~Message((Message *)0x66b87a);
                                    }
                                    local_54 = (uint)!bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)0x66b8e8);
                                    if (local_54 == 0) {
                                      local_63c = 8;
                                      local_640 = Handle::cfunc((Handle *)in_stack_ffffffffffffef80)
                                      ;
                                      testing::internal::EqHelper<false>::Compare<int,int>
                                                (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90
                                                 ,(int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                                  in_stack_ffffffffffffef88),
                                                 (int *)in_stack_ffffffffffffef80);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        (local_638);
                                      if (!bVar1) {
                                        testing::Message::Message
                                                  ((Message *)in_stack_ffffffffffffefb0);
                                        testing::AssertionResult::failure_message
                                                  ((AssertionResult *)0x66b9bb);
                                        testing::internal::AssertHelper::AssertHelper
                                                  (in_stack_ffffffffffffefb0,type,
                                                   (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                                    in_stack_ffffffffffffefa0),
                                                   (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                   in_stack_ffffffffffffef90);
                                        testing::internal::AssertHelper::operator=
                                                  (in_stack_fffffffffffff000,
                                                   in_stack_ffffffffffffeff8);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  (in_stack_ffffffffffffef80);
                                        testing::Message::~Message((Message *)0x66ba1e);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)0x66ba76);
                                      Handle::TaggedPointer<IntType<9>>
                                                ((Handle *)in_stack_ffffffffffffef80,
                                                 (IntType<9> *)in_stack_ffffffffffffef78);
                                      local_674 = 9;
                                      local_678 = IntType<9>::func(local_651);
                                      testing::internal::EqHelper<false>::Compare<int,int>
                                                (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90
                                                 ,(int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                                  in_stack_ffffffffffffef88),
                                                 (int *)in_stack_ffffffffffffef80);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        (&local_670);
                                      if (!bVar1) {
                                        testing::Message::Message
                                                  ((Message *)in_stack_ffffffffffffefb0);
                                        testing::AssertionResult::failure_message
                                                  ((AssertionResult *)0x66bb54);
                                        testing::internal::AssertHelper::AssertHelper
                                                  (in_stack_ffffffffffffefb0,type,
                                                   (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                                    in_stack_ffffffffffffefa0),
                                                   (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                   in_stack_ffffffffffffef90);
                                        testing::internal::AssertHelper::operator=
                                                  (in_stack_fffffffffffff000,
                                                   in_stack_ffffffffffffeff8);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  (in_stack_ffffffffffffef80);
                                        testing::Message::~Message((Message *)0x66bbb7);
                                      }
                                      local_54 = (uint)!bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)0x66bc25);
                                      if (local_54 == 0) {
                                        local_69c = 9;
                                        local_6a0 = Handle::func((Handle *)in_stack_ffffffffffffef80
                                                                );
                                        testing::internal::EqHelper<false>::Compare<int,int>
                                                  (in_stack_ffffffffffffef98,
                                                   in_stack_ffffffffffffef90,
                                                   (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                                   in_stack_ffffffffffffef88),
                                                   (int *)in_stack_ffffffffffffef80);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          (local_698);
                                        if (!bVar1) {
                                          testing::Message::Message
                                                    ((Message *)in_stack_ffffffffffffefb0);
                                          testing::AssertionResult::failure_message
                                                    ((AssertionResult *)0x66bcf8);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (in_stack_ffffffffffffefb0,type,
                                                     (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                                      in_stack_ffffffffffffefa0),
                                                     (int)((ulong)in_stack_ffffffffffffef98 >> 0x20)
                                                     ,in_stack_ffffffffffffef90);
                                          testing::internal::AssertHelper::operator=
                                                    (in_stack_fffffffffffff000,
                                                     in_stack_ffffffffffffeff8);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    (in_stack_ffffffffffffef80);
                                          testing::Message::~Message((Message *)0x66bd5b);
                                        }
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)0x66bdb3);
                                        local_6c4 = 9;
                                        local_6c8 = IntType<9>::cfunc(local_651);
                                        testing::internal::EqHelper<false>::Compare<int,int>
                                                  (in_stack_ffffffffffffef98,
                                                   in_stack_ffffffffffffef90,
                                                   (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                                   in_stack_ffffffffffffef88),
                                                   (int *)in_stack_ffffffffffffef80);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          (local_6c0);
                                        if (!bVar1) {
                                          testing::Message::Message
                                                    ((Message *)in_stack_ffffffffffffefb0);
                                          testing::AssertionResult::failure_message
                                                    ((AssertionResult *)0x66be74);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (in_stack_ffffffffffffefb0,type,
                                                     (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                                      in_stack_ffffffffffffefa0),
                                                     (int)((ulong)in_stack_ffffffffffffef98 >> 0x20)
                                                     ,in_stack_ffffffffffffef90);
                                          testing::internal::AssertHelper::operator=
                                                    (in_stack_fffffffffffff000,
                                                     in_stack_ffffffffffffeff8);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    (in_stack_ffffffffffffef80);
                                          testing::Message::~Message((Message *)0x66bed7);
                                        }
                                        local_54 = (uint)!bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)0x66bf45);
                                        if (local_54 == 0) {
                                          local_6ec = 9;
                                          local_6f0 = Handle::cfunc((Handle *)
                                                                    in_stack_ffffffffffffef80);
                                          testing::internal::EqHelper<false>::Compare<int,int>
                                                    (in_stack_ffffffffffffef98,
                                                     in_stack_ffffffffffffef90,
                                                     (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                                     in_stack_ffffffffffffef88),
                                                     (int *)in_stack_ffffffffffffef80);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            (local_6e8);
                                          if (!bVar1) {
                                            testing::Message::Message
                                                      ((Message *)in_stack_ffffffffffffefb0);
                                            testing::AssertionResult::failure_message
                                                      ((AssertionResult *)0x66c018);
                                            testing::internal::AssertHelper::AssertHelper
                                                      (in_stack_ffffffffffffefb0,type,
                                                       (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                                        in_stack_ffffffffffffefa0),
                                                       (int)((ulong)in_stack_ffffffffffffef98 >>
                                                            0x20),in_stack_ffffffffffffef90);
                                            testing::internal::AssertHelper::operator=
                                                      (in_stack_fffffffffffff000,
                                                       in_stack_ffffffffffffeff8);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (in_stack_ffffffffffffef80);
                                            testing::Message::~Message((Message *)0x66c07b);
                                          }
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)0x66c0d3);
                                          Handle::TaggedPointer<IntType<10>>
                                                    ((Handle *)in_stack_ffffffffffffef80,
                                                     (IntType<10> *)in_stack_ffffffffffffef78);
                                          local_724 = 10;
                                          local_728 = IntType<10>::func(local_701);
                                          testing::internal::EqHelper<false>::Compare<int,int>
                                                    (in_stack_ffffffffffffef98,
                                                     in_stack_ffffffffffffef90,
                                                     (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                                     in_stack_ffffffffffffef88),
                                                     (int *)in_stack_ffffffffffffef80);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            (&local_720);
                                          if (!bVar1) {
                                            testing::Message::Message
                                                      ((Message *)in_stack_ffffffffffffefb0);
                                            testing::AssertionResult::failure_message
                                                      ((AssertionResult *)0x66c1b1);
                                            testing::internal::AssertHelper::AssertHelper
                                                      (in_stack_ffffffffffffefb0,type,
                                                       (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                                        in_stack_ffffffffffffefa0),
                                                       (int)((ulong)in_stack_ffffffffffffef98 >>
                                                            0x20),in_stack_ffffffffffffef90);
                                            testing::internal::AssertHelper::operator=
                                                      (in_stack_fffffffffffff000,
                                                       in_stack_ffffffffffffeff8);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (in_stack_ffffffffffffef80);
                                            testing::Message::~Message((Message *)0x66c214);
                                          }
                                          local_54 = (uint)!bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)0x66c282);
                                          if (local_54 == 0) {
                                            local_74c = 10;
                                            local_750 = Handle::func((Handle *)
                                                                     in_stack_ffffffffffffef80);
                                            testing::internal::EqHelper<false>::Compare<int,int>
                                                      (in_stack_ffffffffffffef98,
                                                       in_stack_ffffffffffffef90,
                                                       (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                                       in_stack_ffffffffffffef88),
                                                       (int *)in_stack_ffffffffffffef80);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              (local_748);
                                            if (!bVar1) {
                                              testing::Message::Message
                                                        ((Message *)in_stack_ffffffffffffefb0);
                                              testing::AssertionResult::failure_message
                                                        ((AssertionResult *)0x66c355);
                                              testing::internal::AssertHelper::AssertHelper
                                                        (in_stack_ffffffffffffefb0,type,
                                                         (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                                          in_stack_ffffffffffffefa0)
                                                         ,(int)((ulong)in_stack_ffffffffffffef98 >>
                                                               0x20),in_stack_ffffffffffffef90);
                                              testing::internal::AssertHelper::operator=
                                                        (in_stack_fffffffffffff000,
                                                         in_stack_ffffffffffffeff8);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (in_stack_ffffffffffffef80);
                                              testing::Message::~Message((Message *)0x66c3b8);
                                            }
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)0x66c410);
                                            local_774 = 10;
                                            local_778 = IntType<10>::cfunc(local_701);
                                            testing::internal::EqHelper<false>::Compare<int,int>
                                                      (in_stack_ffffffffffffef98,
                                                       in_stack_ffffffffffffef90,
                                                       (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                                       in_stack_ffffffffffffef88),
                                                       (int *)in_stack_ffffffffffffef80);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              (local_770);
                                            if (!bVar1) {
                                              testing::Message::Message
                                                        ((Message *)in_stack_ffffffffffffefb0);
                                              testing::AssertionResult::failure_message
                                                        ((AssertionResult *)0x66c4d1);
                                              testing::internal::AssertHelper::AssertHelper
                                                        (in_stack_ffffffffffffefb0,type,
                                                         (char *)CONCAT17(in_stack_ffffffffffffefa7,
                                                                          in_stack_ffffffffffffefa0)
                                                         ,(int)((ulong)in_stack_ffffffffffffef98 >>
                                                               0x20),in_stack_ffffffffffffef90);
                                              testing::internal::AssertHelper::operator=
                                                        (in_stack_fffffffffffff000,
                                                         in_stack_ffffffffffffeff8);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (in_stack_ffffffffffffef80);
                                              testing::Message::~Message((Message *)0x66c534);
                                            }
                                            local_54 = (uint)!bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)0x66c5a2);
                                            if (local_54 == 0) {
                                              local_79c = 10;
                                              local_7a0 = Handle::cfunc((Handle *)
                                                                        in_stack_ffffffffffffef80);
                                              testing::internal::EqHelper<false>::Compare<int,int>
                                                        (in_stack_ffffffffffffef98,
                                                         in_stack_ffffffffffffef90,
                                                         (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                                         in_stack_ffffffffffffef88),
                                                         (int *)in_stack_ffffffffffffef80);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool(local_798);
                                              if (!bVar1) {
                                                testing::Message::Message
                                                          ((Message *)in_stack_ffffffffffffefb0);
                                                testing::AssertionResult::failure_message
                                                          ((AssertionResult *)0x66c675);
                                                testing::internal::AssertHelper::AssertHelper
                                                          (in_stack_ffffffffffffefb0,type,
                                                           (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                testing::internal::AssertHelper::operator=
                                                          (in_stack_fffffffffffff000,
                                                           in_stack_ffffffffffffeff8);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (in_stack_ffffffffffffef80);
                                                testing::Message::~Message((Message *)0x66c6d8);
                                              }
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)0x66c730);
                                              Handle::TaggedPointer<IntType<11>>
                                                        ((Handle *)in_stack_ffffffffffffef80,
                                                         (IntType<11> *)in_stack_ffffffffffffef78);
                                              local_7d4 = 0xb;
                                              local_7d8 = IntType<11>::func(local_7b1);
                                              testing::internal::EqHelper<false>::Compare<int,int>
                                                        (in_stack_ffffffffffffef98,
                                                         in_stack_ffffffffffffef90,
                                                         (int *)CONCAT17(in_stack_ffffffffffffef8f,
                                                                         in_stack_ffffffffffffef88),
                                                         (int *)in_stack_ffffffffffffef80);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool(&local_7d0);
                                              if (!bVar1) {
                                                testing::Message::Message
                                                          ((Message *)in_stack_ffffffffffffefb0);
                                                testing::AssertionResult::failure_message
                                                          ((AssertionResult *)0x66c80e);
                                                testing::internal::AssertHelper::AssertHelper
                                                          (in_stack_ffffffffffffefb0,type,
                                                           (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                testing::internal::AssertHelper::operator=
                                                          (in_stack_fffffffffffff000,
                                                           in_stack_ffffffffffffeff8);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (in_stack_ffffffffffffef80);
                                                testing::Message::~Message((Message *)0x66c871);
                                              }
                                              local_54 = (uint)!bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)0x66c8df);
                                              if (local_54 == 0) {
                                                local_7fc = 0xb;
                                                local_800 = Handle::func((Handle *)
                                                                         in_stack_ffffffffffffef80);
                                                testing::internal::EqHelper<false>::Compare<int,int>
                                                          (in_stack_ffffffffffffef98,
                                                           in_stack_ffffffffffffef90,
                                                           (int *)CONCAT17(in_stack_ffffffffffffef8f
                                                                           ,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool(local_7f8);
                                                if (!bVar1) {
                                                  testing::Message::Message
                                                            ((Message *)in_stack_ffffffffffffefb0);
                                                  testing::AssertionResult::failure_message
                                                            ((AssertionResult *)0x66c9b2);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (in_stack_ffffffffffffefb0,type,
                                                             (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff000,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66ca15);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)0x66ca6d);
                                                local_824 = 0xb;
                                                local_828 = IntType<11>::cfunc(local_7b1);
                                                testing::internal::EqHelper<false>::Compare<int,int>
                                                          (in_stack_ffffffffffffef98,
                                                           in_stack_ffffffffffffef90,
                                                           (int *)CONCAT17(in_stack_ffffffffffffef8f
                                                                           ,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool(local_820);
                                                if (!bVar1) {
                                                  testing::Message::Message
                                                            ((Message *)in_stack_ffffffffffffefb0);
                                                  testing::AssertionResult::failure_message
                                                            ((AssertionResult *)0x66cb2e);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (in_stack_ffffffffffffefb0,type,
                                                             (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff000,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66cb91);
                                                }
                                                local_54 = (uint)!bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)0x66cbff);
                                                if (local_54 == 0) {
                                                  local_84c = 0xb;
                                                  local_850 = Handle::cfunc((Handle *)
                                                                                                                                                        
                                                  in_stack_ffffffffffffef80);
                                                  testing::internal::EqHelper<false>::
                                                  Compare<int,int>(in_stack_ffffffffffffef98,
                                                                   in_stack_ffffffffffffef90,
                                                                   (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_848);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_ffffffffffffefb0)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x66ccd2);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_ffffffffffffefb0,type,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff000,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66cd35);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66cd8d);
                                                  Handle::TaggedPointer<IntType<12>>
                                                            ((Handle *)in_stack_ffffffffffffef80,
                                                             (IntType<12> *)
                                                             in_stack_ffffffffffffef78);
                                                  local_884 = 0xc;
                                                  local_888 = IntType<12>::func(local_861);
                                                  testing::internal::EqHelper<false>::
                                                  Compare<int,int>(in_stack_ffffffffffffef98,
                                                                   in_stack_ffffffffffffef90,
                                                                   (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_880);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_ffffffffffffefb0)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x66ce6b);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_ffffffffffffefb0,type,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff000,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66cece);
                                                  }
                                                  local_54 = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66cf3c);
                                                  if (local_54 == 0) {
                                                    local_8ac = 0xc;
                                                    local_8b0 = Handle::func((Handle *)
                                                                                                                                                          
                                                  in_stack_ffffffffffffef80);
                                                  testing::internal::EqHelper<false>::
                                                  Compare<int,int>(in_stack_ffffffffffffef98,
                                                                   in_stack_ffffffffffffef90,
                                                                   (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_8a8);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_ffffffffffffefb0)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x66d00f);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_ffffffffffffefb0,type,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff000,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66d072);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66d0ca);
                                                  local_8d4 = 0xc;
                                                  local_8d8 = IntType<12>::cfunc(local_861);
                                                  testing::internal::EqHelper<false>::
                                                  Compare<int,int>(in_stack_ffffffffffffef98,
                                                                   in_stack_ffffffffffffef90,
                                                                   (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_8d0);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_ffffffffffffefb0)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x66d18b);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_ffffffffffffefb0,type,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff000,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66d1ee);
                                                  }
                                                  local_54 = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66d25c);
                                                  if (local_54 == 0) {
                                                    local_8fc = 0xc;
                                                    local_900 = Handle::cfunc((Handle *)
                                                                                                                                                            
                                                  in_stack_ffffffffffffef80);
                                                  testing::internal::EqHelper<false>::
                                                  Compare<int,int>(in_stack_ffffffffffffef98,
                                                                   in_stack_ffffffffffffef90,
                                                                   (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_8f8);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_ffffffffffffefb0)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x66d32f);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_ffffffffffffefb0,type,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff000,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66d392);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66d3ea);
                                                  Handle::TaggedPointer<IntType<13>>
                                                            ((Handle *)in_stack_ffffffffffffef80,
                                                             (IntType<13> *)
                                                             in_stack_ffffffffffffef78);
                                                  local_934 = 0xd;
                                                  local_938 = IntType<13>::func(local_911);
                                                  testing::internal::EqHelper<false>::
                                                  Compare<int,int>(in_stack_ffffffffffffef98,
                                                                   in_stack_ffffffffffffef90,
                                                                   (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_930);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_ffffffffffffefb0)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x66d4c8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_ffffffffffffefb0,type,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff000,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66d52b);
                                                  }
                                                  local_54 = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66d599);
                                                  if (local_54 == 0) {
                                                    local_95c = 0xd;
                                                    local_960 = Handle::func((Handle *)
                                                                                                                                                          
                                                  in_stack_ffffffffffffef80);
                                                  testing::internal::EqHelper<false>::
                                                  Compare<int,int>(in_stack_ffffffffffffef98,
                                                                   in_stack_ffffffffffffef90,
                                                                   (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_958);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_ffffffffffffefb0)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x66d66c);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_ffffffffffffefb0,type,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            (in_stack_fffffffffffff000,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66d6cf);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66d727);
                                                  local_984 = 0xd;
                                                  local_988 = IntType<13>::cfunc(local_911);
                                                  this_03 = local_980;
                                                  testing::internal::EqHelper<false>::
                                                  Compare<int,int>(in_stack_ffffffffffffef98,
                                                                   in_stack_ffffffffffffef90,
                                                                   (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(this_03);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_ffffffffffffefb0)
                                                    ;
                                                    in_stack_ffffffffffffeff8 =
                                                         (Message *)
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x66d7e8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_ffffffffffffefb0,type,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)this_03,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66d84b);
                                                  }
                                                  local_54 = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66d8b9);
                                                  if (local_54 == 0) {
                                                    local_9ac = 0xd;
                                                    local_9b0 = Handle::cfunc((Handle *)
                                                                                                                                                            
                                                  in_stack_ffffffffffffef80);
                                                  testing::internal::EqHelper<false>::
                                                  Compare<int,int>(in_stack_ffffffffffffef98,
                                                                   in_stack_ffffffffffffef90,
                                                                   (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(local_9a8);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_ffffffffffffefb0)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x66d980);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_ffffffffffffefb0,type,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)this_03,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66d9dd);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66da35);
                                                  Handle::TaggedPointer<IntType<14>>
                                                            ((Handle *)in_stack_ffffffffffffef80,
                                                             in_stack_ffffffffffffef78);
                                                  local_9e4 = 0xe;
                                                  local_9e8 = IntType<14>::func(local_9c1);
                                                  testing::internal::EqHelper<false>::
                                                  Compare<int,int>(in_stack_ffffffffffffef98,
                                                                   in_stack_ffffffffffffef90,
                                                                   (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_9e0);
                                                  if (!bVar1) {
                                                    testing::Message::Message
                                                              ((Message *)in_stack_ffffffffffffefb0)
                                                    ;
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x66db01);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (in_stack_ffffffffffffefb0,type,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)this_03,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66db5e);
                                                  }
                                                  local_54 = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66dbcc);
                                                  if (local_54 == 0) {
                                                    local_a0c = 0xe;
                                                    local_a10 = Handle::func((Handle *)
                                                                                                                                                          
                                                  in_stack_ffffffffffffef80);
                                                  this_02 = local_a08;
                                                  testing::internal::EqHelper<false>::
                                                  Compare<int,int>(in_stack_ffffffffffffef98,
                                                                   in_stack_ffffffffffffef90,
                                                                   (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                  iVar3 = (int)((ulong)in_stack_ffffffffffffef98 >>
                                                               0x20);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(this_02);
                                                  if (!bVar1) {
                                                    testing::Message::Message((Message *)this_02);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x66dc93);
                                                    type = (Type)((ulong)pcVar2 >> 0x20);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)this_02,type,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffefa7,
                                                  in_stack_ffffffffffffefa0),iVar3,
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)this_03,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66dcf0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66dd45);
                                                  local_a34 = 0xe;
                                                  local_a38 = IntType<14>::cfunc(local_9c1);
                                                  this_01 = local_a30;
                                                  testing::internal::EqHelper<false>::
                                                  Compare<int,int>(&this_01->success_,
                                                                   in_stack_ffffffffffffef90,
                                                                   (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),
                                                  (int *)in_stack_ffffffffffffef80);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(this_01);
                                                  uVar4 = bVar1;
                                                  if (!bVar1) {
                                                    testing::Message::Message((Message *)this_02);
                                                    in_stack_ffffffffffffef90 =
                                                         testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x66ddfa);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)this_02,type,
                                                               (char *)CONCAT17(uVar4,
                                                  in_stack_ffffffffffffefa0),
                                                  (int)((ulong)this_01 >> 0x20),
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)this_03,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (in_stack_ffffffffffffef80);
                                                  testing::Message::~Message((Message *)0x66de57);
                                                  }
                                                  local_54 = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66dec5);
                                                  if (local_54 == 0) {
                                                    Handle::cfunc((Handle *)
                                                                  in_stack_ffffffffffffef80);
                                                    this_00 = local_a58;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>(&this_01->success_,
                                                                     in_stack_ffffffffffffef90,
                                                                     (int *)CONCAT17(
                                                  in_stack_ffffffffffffef8f,
                                                  in_stack_ffffffffffffef88),(int *)this_00);
                                                  iVar3 = (int)((ulong)this_01 >> 0x20);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(this_00);
                                                  if (!bVar1) {
                                                    testing::Message::Message((Message *)this_02);
                                                    testing::AssertionResult::failure_message
                                                              ((AssertionResult *)0x66df8c);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)this_02,type,
                                                               (char *)CONCAT17(uVar4,
                                                  in_stack_ffffffffffffefa0),iVar3,
                                                  in_stack_ffffffffffffef90);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)this_03,
                                                             in_stack_ffffffffffffeff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)this_00);
                                                  testing::Message::~Message((Message *)0x66dfe7);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x66e03c);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(TaggedPointer, Dispatch) {
    IntType<0> it0;
    Handle h0(&it0);
    ASSERT_EQ(0, it0.func());
    EXPECT_EQ(0, h0.func());
    ASSERT_EQ(0, it0.cfunc());
    EXPECT_EQ(0, h0.cfunc());

    IntType<1> it1;
    Handle h1(&it1);
    ASSERT_EQ(1, it1.func());
    EXPECT_EQ(1, h1.func());
    ASSERT_EQ(1, it1.cfunc());
    EXPECT_EQ(1, h1.cfunc());

    IntType<2> it2;
    Handle h2(&it2);
    ASSERT_EQ(2, it2.func());
    EXPECT_EQ(2, h2.func());
    ASSERT_EQ(2, it2.cfunc());
    EXPECT_EQ(2, h2.cfunc());

    IntType<3> it3;
    Handle h3(&it3);
    ASSERT_EQ(3, it3.func());
    EXPECT_EQ(3, h3.func());
    ASSERT_EQ(3, it3.cfunc());
    EXPECT_EQ(3, h3.cfunc());

    IntType<4> it4;
    Handle h4(&it4);
    ASSERT_EQ(4, it4.func());
    EXPECT_EQ(4, h4.func());
    ASSERT_EQ(4, it4.cfunc());
    EXPECT_EQ(4, h4.cfunc());

    IntType<5> it5;
    Handle h5(&it5);
    ASSERT_EQ(5, it5.func());
    EXPECT_EQ(5, h5.func());
    ASSERT_EQ(5, it5.cfunc());
    EXPECT_EQ(5, h5.cfunc());

    IntType<6> it6;
    Handle h6(&it6);
    ASSERT_EQ(6, it6.func());
    EXPECT_EQ(6, h6.func());
    ASSERT_EQ(6, it6.cfunc());
    EXPECT_EQ(6, h6.cfunc());

    IntType<7> it7;
    Handle h7(&it7);
    ASSERT_EQ(7, it7.func());
    EXPECT_EQ(7, h7.func());
    ASSERT_EQ(7, it7.cfunc());
    EXPECT_EQ(7, h7.cfunc());

    IntType<8> it8;
    Handle h8(&it8);
    ASSERT_EQ(8, it8.func());
    EXPECT_EQ(8, h8.func());
    ASSERT_EQ(8, it8.cfunc());
    EXPECT_EQ(8, h8.cfunc());

    IntType<9> it9;
    Handle h9(&it9);
    ASSERT_EQ(9, it9.func());
    EXPECT_EQ(9, h9.func());
    ASSERT_EQ(9, it9.cfunc());
    EXPECT_EQ(9, h9.cfunc());

    IntType<10> it10;
    Handle h10(&it10);
    ASSERT_EQ(10, it10.func());
    EXPECT_EQ(10, h10.func());
    ASSERT_EQ(10, it10.cfunc());
    EXPECT_EQ(10, h10.cfunc());

    IntType<11> it11;
    Handle h11(&it11);
    ASSERT_EQ(11, it11.func());
    EXPECT_EQ(11, h11.func());
    ASSERT_EQ(11, it11.cfunc());
    EXPECT_EQ(11, h11.cfunc());

    IntType<12> it12;
    Handle h12(&it12);
    ASSERT_EQ(12, it12.func());
    EXPECT_EQ(12, h12.func());
    ASSERT_EQ(12, it12.cfunc());
    EXPECT_EQ(12, h12.cfunc());

    IntType<13> it13;
    Handle h13(&it13);
    ASSERT_EQ(13, it13.func());
    EXPECT_EQ(13, h13.func());
    ASSERT_EQ(13, it13.cfunc());
    EXPECT_EQ(13, h13.cfunc());

    IntType<14> it14;
    Handle h14(&it14);
    ASSERT_EQ(14, it14.func());
    EXPECT_EQ(14, h14.func());
    ASSERT_EQ(14, it14.cfunc());
    EXPECT_EQ(14, h14.cfunc());
}